

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

void __thiscall
Js::JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
          (JavascriptPromiseAllResolveElementFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,uint32 index,JavascriptArray *values,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper
          *remainingElementsWrapper)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_013cb338;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseCapability>::WriteBarrierSet
            (&this->capabilities,capabilities);
  this->index = index;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>::
  WriteBarrierSet(&this->remainingElementsWrapper,remainingElementsWrapper);
  Memory::WriteBarrierPtr<Js::JavascriptArray>::WriteBarrierSet(&this->values,values);
  this->alreadyCalled = false;
  return;
}

Assistant:

JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction(DynamicType* type, FunctionInfo* functionInfo, uint32 index, JavascriptArray* values, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper)
        : RuntimeFunction(type, functionInfo), index(index), values(values), capabilities(capabilities), remainingElementsWrapper(remainingElementsWrapper), alreadyCalled(false)
    { }